

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Move.h
# Opt level: O0

void __thiscall clunk::Move::Init(Move *this,uint32_t bits,int score)

{
  bool local_21;
  int score_local;
  uint32_t bits_local;
  Move *this_local;
  
  this->bits = bits;
  this->score = score;
  if (score < 1) {
    score = -score;
  }
  if (32000 < score) {
    __assert_fail("abs(score) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Move.h"
                  ,0x47,"void clunk::Move::Init(const uint32_t, const int)");
  }
  local_21 = true;
  if (bits != 0) {
    local_21 = IsValid(this);
  }
  if (local_21 == false) {
    __assert_fail("!bits || IsValid()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Move.h"
                  ,0x48,"void clunk::Move::Init(const uint32_t, const int)");
  }
  return;
}

Assistant:

void Init(const uint32_t bits, const int score) {
    this->bits = bits;
    this->score = static_cast<int32_t>(score);
    assert(abs(score) <= Infinity);
    assert(!bits || IsValid());
  }